

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint inflateNoCompression(ucvector *out,uchar *in,size_t *bp,size_t *pos,size_t inlength)

{
  uchar uVar1;
  uchar *puVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint local_4c;
  uint error;
  uint n;
  uint NLEN;
  uint LEN;
  size_t p;
  size_t inlength_local;
  size_t *pos_local;
  size_t *bp_local;
  uchar *in_local;
  ucvector *out_local;
  
  while ((*bp & 7) != 0) {
    *bp = *bp + 1;
  }
  uVar6 = *bp >> 3;
  if (uVar6 + 4 < inlength) {
    uVar4 = (uint)in[uVar6] + (uint)in[uVar6 + 1] * 0x100;
    if (uVar4 + (uint)in[uVar6 + 2] + (uint)in[uVar6 + 3] * 0x100 == 0xffff) {
      uVar5 = ucvector_resize(out,*pos + (ulong)uVar4);
      if (uVar5 == 0) {
        out_local._4_4_ = 0x53;
      }
      else if (inlength < uVar6 + 4 + (ulong)uVar4) {
        out_local._4_4_ = 0x17;
      }
      else {
        _NLEN = uVar6 + 4;
        for (local_4c = 0; local_4c < uVar4; local_4c = local_4c + 1) {
          uVar1 = in[_NLEN];
          puVar2 = out->data;
          sVar3 = *pos;
          *pos = sVar3 + 1;
          puVar2[sVar3] = uVar1;
          _NLEN = _NLEN + 1;
        }
        *bp = _NLEN << 3;
        out_local._4_4_ = 0;
      }
    }
    else {
      out_local._4_4_ = 0x15;
    }
  }
  else {
    out_local._4_4_ = 0x34;
  }
  return out_local._4_4_;
}

Assistant:

static unsigned inflateNoCompression(ucvector* out, const unsigned char* in, size_t* bp, size_t* pos, size_t inlength)
{
  size_t p;
  unsigned LEN, NLEN, n, error = 0;

  /*go to first boundary of byte*/
  while(((*bp) & 0x7) != 0) ++(*bp);
  p = (*bp) / 8; /*byte position*/

  /*read LEN (2 bytes) and NLEN (2 bytes)*/
  if(p + 4 >= inlength) return 52; /*error, bit pointer will jump past memory*/
  LEN = in[p] + 256u * in[p + 1]; p += 2;
  NLEN = in[p] + 256u * in[p + 1]; p += 2;

  /*check if 16-bit NLEN is really the one's complement of LEN*/
  if(LEN + NLEN != 65535) return 21; /*error: NLEN is not one's complement of LEN*/

  if(!ucvector_resize(out, (*pos) + LEN)) return 83; /*alloc fail*/

  /*read the literal data: LEN bytes are now stored in the out buffer*/
  if(p + LEN > inlength) return 23; /*error: reading outside of in buffer*/
  for(n = 0; n < LEN; ++n) out->data[(*pos)++] = in[p++];

  (*bp) = p * 8;

  return error;
}